

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

size_t __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
SpaceUsedExcludingSelfLong
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  size_t sVar1;
  
  sVar1 = internal::RepeatedPtrFieldBase::
          SpaceUsedExcludingSelfLong<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (&this->super_RepeatedPtrFieldBase);
  return sVar1;
}

Assistant:

inline size_t RepeatedPtrField<Element>::SpaceUsedExcludingSelfLong() const {
  return RepeatedPtrFieldBase::SpaceUsedExcludingSelfLong<TypeHandler>();
}